

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

Instr * Peeps::PeepUnreachableLabel(LabelInstr *deadLabel,bool isInHelper,bool *peepedRef)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  ulong in_RAX;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  LabelInstr *pLVar7;
  Instr *pIVar8;
  undefined8 uStack_38;
  bool wasStatementBoundaryKeptInDeadBlock;
  
  uStack_38 = in_RAX;
  if (deadLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3a6,"(deadLabel)","deadLabel");
    if (!bVar3) goto LAB_005acabd;
    *puVar5 = 0;
  }
  pLVar6 = deadLabel;
  if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
       (deadLabel->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next != &deadLabel->labelRefs) ||
     ((deadLabel->field_0x78 & 4) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3a7,"(deadLabel->IsUnreferenced())","deadLabel->IsUnreferenced()");
    if (!bVar3) {
LAB_005acabd:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  do {
    pLVar6 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar6->super_Instr);
    IVar1 = (pLVar6->super_Instr).m_kind;
    if (((IVar1 != InstrKindProfiledLabel) && (IVar1 != InstrKindLabel)) ||
       (pLVar7 = IR::Instr::AsLabelInstr((Instr *)pLVar6),
       (SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
       (pLVar7->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next != &pLVar7->labelRefs)) break;
  } while ((pLVar7->field_0x78 & 4) == 0);
  bVar3 = IR::Instr::HasFallThrough((Instr *)pLVar6);
  if (bVar3) {
    pIVar8 = (deadLabel->super_Instr).m_next;
    bVar4 = ((deadLabel->field_0x78 & 2) == 0) != isInHelper && (deadLabel->field_0x78 & 0x20) == 0;
    if (peepedRef != (bool *)0x0) {
      *peepedRef = (bool)bVar4;
    }
  }
  else {
    uStack_38 = uStack_38 & 0xffffffffffffff;
    pIVar8 = RemoveDeadBlock((deadLabel->super_Instr).m_next,(bool *)((long)&uStack_38 + 7));
    if (peepedRef != (bool *)0x0) {
      *peepedRef = true;
    }
    bVar4 = uStack_38._7_1_ ^ 1;
  }
  if (((bVar4 != 0) &&
      ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
       (deadLabel->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next == &deadLabel->labelRefs)) &&
     ((deadLabel->field_0x78 & 4) == 0)) {
    IR::Instr::Remove(&deadLabel->super_Instr);
  }
  return pIVar8;
}

Assistant:

IR::Instr *
Peeps::PeepUnreachableLabel(IR::LabelInstr *deadLabel, const bool isInHelper, bool *const peepedRef)
{
    Assert(deadLabel);
    Assert(deadLabel->IsUnreferenced());

    IR::Instr *prevFallthroughInstr = deadLabel;
    do
    {
        prevFallthroughInstr = prevFallthroughInstr->GetPrevRealInstrOrLabel();
        // The previous dead label may have been kept around due to a StatementBoundary, see comment in RemoveDeadBlock.
    } while(prevFallthroughInstr->IsLabelInstr() && prevFallthroughInstr->AsLabelInstr()->IsUnreferenced());

    IR::Instr *instrReturn;
    bool removeLabel;

    // If code is now unreachable, delete block
    if (!prevFallthroughInstr->HasFallThrough())
    {
        bool wasStatementBoundaryKeptInDeadBlock = false;
        instrReturn = RemoveDeadBlock(deadLabel->m_next, &wasStatementBoundaryKeptInDeadBlock);

        // Remove label only if we didn't have to keep last StatementBoundary in the dead block,
        // see comment in RemoveDeadBlock.
        removeLabel = !wasStatementBoundaryKeptInDeadBlock;

        if(peepedRef)
        {
            *peepedRef = true;
        }
    }
    else
    {
        instrReturn = deadLabel->m_next;
        removeLabel =
            deadLabel->isOpHelper == isInHelper
#if DBG
            && !deadLabel->m_noHelperAssert
#endif
            ;
        if(peepedRef)
        {
            *peepedRef = removeLabel;
        }
    }

    if (removeLabel && deadLabel->IsUnreferenced())
    {
        deadLabel->Remove();
    }

    return instrReturn;
}